

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O3

_Bool al_color_html_to_rgb(char *string,float *red,float *green,float *blue)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  _Bool _Var4;
  int ib;
  int ig;
  int ir;
  int local_34;
  int local_30;
  int local_2c;
  
  _Var4 = false;
  *blue = 0.0;
  *green = 0.0;
  *red = 0.0;
  cVar1 = *string;
  sVar3 = strlen(string + (cVar1 == '#'));
  if (sVar3 == 6) {
    _Var4 = false;
    iVar2 = __isoc99_sscanf(string + (cVar1 == '#'),"%02x%02x%02x",&local_2c,&local_30,&local_34);
    if (iVar2 == 3) {
      *red = (float)local_2c / 255.0;
      *green = (float)local_30 / 255.0;
      *blue = (float)local_34 / 255.0;
      _Var4 = true;
    }
  }
  return _Var4;
}

Assistant:

bool al_color_html_to_rgb(char const *string,
   float *red, float *green, float *blue)
{
   char const *ptr = string;
   int ir, ig, ib;
   ASSERT(ptr);
   ASSERT(red);
   ASSERT(green);
   ASSERT(blue);

   *red = *green = *blue = 0.0f;

   if (*ptr == '#')
      ptr++;

   if (strlen(ptr) != 6)
      return false;

   if (sscanf(ptr, "%02x%02x%02x", &ir, &ig, &ib) != 3)
      return false;

   *red = ir / 255.0;
   *green = ig / 255.0;
   *blue = ib / 255.0;
   return true;
}